

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericunixtheme.cpp
# Opt level: O0

QStringList * QGenericUnixTheme::themeNames(void)

{
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  bool bVar1;
  int iVar2;
  QPlatformIntegration *pQVar3;
  undefined4 extraout_var;
  ulong uVar4;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar5;
  QByteArray *desktopName;
  QList<QByteArray> *__range2;
  QStringList *result;
  char16_t *str;
  QString s;
  const_iterator __end2;
  const_iterator __begin2;
  QList<QByteArray> desktopNames;
  QList<QByteArray> gtkBasedEnvironments;
  QByteArray desktopEnvironment;
  DataPointer *in_stack_fffffffffffffd68;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffd70;
  QList<QByteArray> *in_stack_fffffffffffffd78;
  QLatin1String *in_stack_fffffffffffffd80;
  QStringList *pQVar6;
  undefined1 local_1e0 [48];
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  QArrayDataPointer<char16_t> local_170 [3];
  char *local_118;
  QByteArray *local_110;
  const_iterator local_108;
  const_iterator local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  QByteArray local_e0;
  QByteArray local_c8;
  QByteArray local_b0;
  QByteArray local_98;
  QByteArray local_80;
  QByteArray local_68;
  QByteArray local_50;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  pQVar6 = in_RDI;
  QList<QString>::QList((QList<QString> *)0xae46a8);
  bVar1 = QGuiApplication::desktopSettingsAware();
  if (bVar1) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = QGuiApplicationPrivate::platformIntegration();
    iVar2 = (*pQVar3->_vptr_QPlatformIntegration[0x13])();
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x20))(&local_20);
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QByteArray>::QList((QList<QByteArray> *)0xae473f);
    QByteArray::QByteArray(&local_50,"GNOME",-1);
    in_stack_fffffffffffffd70 =
         (QArrayDataPointer<char16_t> *)
         QList<QByteArray>::operator<<
                   ((QList<QByteArray> *)in_stack_fffffffffffffd70,
                    (rvalue_ref)in_stack_fffffffffffffd68);
    QByteArray::QByteArray(&local_68,"X-CINNAMON",-1);
    in_stack_fffffffffffffd78 =
         QList<QByteArray>::operator<<
                   ((QList<QByteArray> *)in_stack_fffffffffffffd70,
                    (rvalue_ref)in_stack_fffffffffffffd68);
    QByteArray::QByteArray(&local_80,"PANTHEON",-1);
    in_stack_fffffffffffffd80 =
         (QLatin1String *)
         QList<QByteArray>::operator<<
                   ((QList<QByteArray> *)in_stack_fffffffffffffd70,
                    (rvalue_ref)in_stack_fffffffffffffd68);
    QByteArray::QByteArray(&local_98,"UNITY",-1);
    QList<QByteArray>::operator<<
              ((QList<QByteArray> *)in_stack_fffffffffffffd70,(rvalue_ref)in_stack_fffffffffffffd68)
    ;
    QByteArray::QByteArray(&local_b0,"MATE",-1);
    QList<QByteArray>::operator<<
              ((QList<QByteArray> *)in_stack_fffffffffffffd70,(rvalue_ref)in_stack_fffffffffffffd68)
    ;
    QByteArray::QByteArray(&local_c8,"XFCE",-1);
    QList<QByteArray>::operator<<
              ((QList<QByteArray> *)in_stack_fffffffffffffd70,(rvalue_ref)in_stack_fffffffffffffd68)
    ;
    QByteArray::QByteArray(&local_e0,"LXDE",-1);
    QList<QByteArray>::operator<<
              ((QList<QByteArray> *)in_stack_fffffffffffffd70,(rvalue_ref)in_stack_fffffffffffffd68)
    ;
    QByteArray::~QByteArray((QByteArray *)0xae48a8);
    QByteArray::~QByteArray((QByteArray *)0xae48b5);
    QByteArray::~QByteArray((QByteArray *)0xae48c2);
    QByteArray::~QByteArray((QByteArray *)0xae48cf);
    QByteArray::~QByteArray((QByteArray *)0xae48dc);
    QByteArray::~QByteArray((QByteArray *)0xae48e9);
    QByteArray::~QByteArray((QByteArray *)0xae48f6);
    local_f8 = &DAT_aaaaaaaaaaaaaaaa;
    local_f0 = &DAT_aaaaaaaaaaaaaaaa;
    local_e8 = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::split((char)&local_f8);
    local_100.i = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
    local_100 = QList<QByteArray>::begin((QList<QByteArray> *)in_stack_fffffffffffffd70);
    local_108.i = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
    local_108 = QList<QByteArray>::end((QList<QByteArray> *)in_stack_fffffffffffffd70);
    while( true ) {
      local_110 = local_108.i;
      bVar1 = QList<QByteArray>::const_iterator::operator!=(&local_100,local_108);
      if (!bVar1) break;
      QList<QByteArray>::const_iterator::operator*(&local_100);
      local_118 = "KDE";
      bVar1 = ::operator==((QByteArray *)in_stack_fffffffffffffd80,
                           (char **)in_stack_fffffffffffffd78);
      if (bVar1) {
        QLatin1String::QLatin1String(in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78);
        QVar5.m_data = (char *)pQVar6;
        QVar5.m_size = (qsizetype)in_RDI;
        QString::QString((QString *)in_stack_fffffffffffffd80,QVar5);
        QList<QString>::push_back
                  ((QList<QString> *)in_stack_fffffffffffffd70,(rvalue_ref)in_stack_fffffffffffffd68
                  );
        QString::~QString((QString *)0xae4a67);
      }
      else {
        bVar1 = QListSpecialMethodsBase<QByteArray>::contains<QByteArray>
                          ((QListSpecialMethodsBase<QByteArray> *)in_stack_fffffffffffffd70,
                           (QByteArray *)in_stack_fffffffffffffd68);
        if (bVar1) {
          QArrayDataPointer<char16_t>::QArrayDataPointer(local_170,(Data *)0x0,L"gtk3",4);
          QString::QString((QString *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
          QList<QString>::push_back
                    ((QList<QString> *)in_stack_fffffffffffffd70,
                     (rvalue_ref)in_stack_fffffffffffffd68);
          QString::~QString((QString *)0xae4b02);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffd70);
          QLatin1String::QLatin1String(in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78);
          latin1.m_data = (char *)pQVar6;
          latin1.m_size = (qsizetype)in_RDI;
          QString::QString((QString *)in_stack_fffffffffffffd80,latin1);
          QList<QString>::push_back
                    ((QList<QString> *)in_stack_fffffffffffffd70,
                     (rvalue_ref)in_stack_fffffffffffffd68);
          QString::~QString((QString *)0xae4b62);
        }
        else {
          local_1b0 = &DAT_aaaaaaaaaaaaaaaa;
          local_1a8 = &DAT_aaaaaaaaaaaaaaaa;
          local_1a0 = &DAT_aaaaaaaaaaaaaaaa;
          QByteArray::toLower((QByteArray *)in_stack_fffffffffffffd68);
          QString::fromLatin1<void>((QByteArray *)in_stack_fffffffffffffd70);
          QByteArray::~QByteArray((QByteArray *)0xae4bc8);
          QVar5 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_fffffffffffffd78,(size_t)in_stack_fffffffffffffd70);
          uVar4 = QString::startsWith((QLatin1String *)&local_1b0,(CaseSensitivity)QVar5.m_size);
          if ((uVar4 & 1) == 0) {
            QString::QString((QString *)in_stack_fffffffffffffd70,
                             (QString *)in_stack_fffffffffffffd68);
          }
          else {
            QString::mid((longlong)local_1e0,(longlong)&local_1b0);
          }
          QList<QString>::push_back
                    ((QList<QString> *)in_stack_fffffffffffffd70,
                     (rvalue_ref)in_stack_fffffffffffffd68);
          QString::~QString((QString *)0xae4c5c);
          QString::~QString((QString *)0xae4c69);
        }
      }
      QList<QByteArray>::const_iterator::operator++(&local_100);
    }
    QList<QByteArray>::~QList((QList<QByteArray> *)0xae4c8c);
    QList<QByteArray>::~QList((QList<QByteArray> *)0xae4c99);
    QByteArray::~QByteArray((QByteArray *)0xae4ca6);
  }
  QLatin1String::QLatin1String(in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78);
  latin1_00.m_data = (char *)pQVar6;
  latin1_00.m_size = (qsizetype)in_RDI;
  QString::QString((QString *)in_stack_fffffffffffffd80,latin1_00);
  QList<QString>::append
            ((QList<QString> *)in_stack_fffffffffffffd70,(rvalue_ref)in_stack_fffffffffffffd68);
  QString::~QString((QString *)0xae4cf9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar6;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QGenericUnixTheme::themeNames()
{
    QStringList result;
    if (QGuiApplication::desktopSettingsAware()) {
        const QByteArray desktopEnvironment = QGuiApplicationPrivate::platformIntegration()->services()->desktopEnvironment();
        QList<QByteArray> gtkBasedEnvironments;
        gtkBasedEnvironments << "GNOME"
                             << "X-CINNAMON"
                             << "PANTHEON"
                             << "UNITY"
                             << "MATE"
                             << "XFCE"
                             << "LXDE";
        const QList<QByteArray> desktopNames = desktopEnvironment.split(':');
        for (const QByteArray &desktopName : desktopNames) {
#if QT_CONFIG(dbus) && QT_CONFIG(settings) && (QT_CONFIG(xcb) || QT_CONFIG(wayland))
            if (desktopEnvironment == "KDE") {
                result.push_back(QLatin1StringView(QKdeTheme::name));
            } else
#endif
           if (gtkBasedEnvironments.contains(desktopName)) {
                // prefer the GTK3 theme implementation with native dialogs etc.
                result.push_back(QStringLiteral("gtk3"));
                // fallback to the generic Gnome theme if loading the GTK3 theme fails
                result.push_back(QLatin1StringView(QGnomeTheme::name));
            } else {
                // unknown, but lowercase the name (our standard practice) and
                // remove any "x-" prefix
                QString s = QString::fromLatin1(desktopName.toLower());
                result.push_back(s.startsWith("x-"_L1) ? s.mid(2) : s);
            }
        }
    } // desktopSettingsAware
    result.append(QLatin1StringView(QGenericUnixTheme::name));
    return result;
}